

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNullInLargeMap(ExtensionSet *this,int key)

{
  bool bVar1;
  reference ppVar2;
  Extension *pEVar3;
  iterator iVar4;
  const_iterator it;
  int local_34;
  btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  local_30;
  iterator local_20;
  
  local_34 = key;
  if ((short)this->flat_size_ < 0) {
    iVar4 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            ::find<int>((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                         *)(this->map_).flat,&local_34);
    local_30.node_ =
         (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
          *)iVar4.node_;
    local_30.position_ = iVar4.position_;
    iVar4 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            ::end((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)(this->map_).flat);
    local_20.node_ = iVar4.node_;
    local_20.position_ = iVar4.position_;
    bVar1 = absl::lts_20240722::container_internal::
            btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
            ::operator!=(&local_30,&local_20);
    if (bVar1) {
      ppVar2 = absl::lts_20240722::container_internal::
               btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
               ::operator*(&local_30);
      pEVar3 = &ppVar2->second;
    }
    else {
      pEVar3 = (Extension *)0x0;
    }
    return pEVar3;
  }
  __assert_fail("is_large()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                ,0x663,
                "const ExtensionSet::Extension *google::protobuf::internal::ExtensionSet::FindOrNullInLargeMap(int) const"
               );
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNullInLargeMap(
    int key) const {
  assert(is_large());
  LargeMap::const_iterator it = map_.large->find(key);
  if (it != map_.large->end()) {
    return &it->second;
  }
  return nullptr;
}